

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::BayesianProbitRegressor_FeatureWeight::InternalSwap
          (BayesianProbitRegressor_FeatureWeight *this,BayesianProbitRegressor_FeatureWeight *other)

{
  BayesianProbitRegressor_FeatureWeight *other_local;
  BayesianProbitRegressor_FeatureWeight *this_local;
  
  google::protobuf::internal::InternalMetadata::InternalSwap
            (&(this->super_MessageLite)._internal_metadata_,
             &(other->super_MessageLite)._internal_metadata_);
  google::protobuf::
  RepeatedPtrField<CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight>::InternalSwap
            (&this->weights_,&other->weights_);
  std::swap<unsigned_int>(&this->featureid_,&other->featureid_);
  return;
}

Assistant:

void BayesianProbitRegressor_FeatureWeight::InternalSwap(BayesianProbitRegressor_FeatureWeight* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  weights_.InternalSwap(&other->weights_);
  swap(featureid_, other->featureid_);
}